

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Parser *cli;
  value_type local_2728;
  value_type local_2708;
  Parser *local_26e8;
  value_type local_26e0;
  long *local_26c0;
  long local_26b8;
  long local_26b0 [2];
  long *local_26a0;
  long local_2698;
  long local_2690 [2];
  long *local_2680;
  long local_2678;
  long local_2670 [2];
  long *local_2660;
  long local_2658;
  long local_2650 [2];
  long *local_2640;
  long local_2638;
  long local_2630 [2];
  long *local_2620;
  long local_2618;
  long local_2610 [2];
  long *local_2600;
  long local_25f8;
  long local_25f0 [2];
  value_type local_25e0;
  long *local_25c0;
  long local_25b8;
  long local_25b0 [2];
  value_type local_25a0;
  long *local_2580;
  long local_2578;
  long local_2570 [2];
  value_type local_2560;
  value_type local_2540;
  value_type local_2520;
  value_type local_2500;
  value_type local_24e0;
  value_type local_24c0;
  long *local_24a0;
  long local_2498;
  long local_2490 [2];
  value_type local_2480;
  value_type local_2460;
  value_type local_2440;
  value_type local_2420;
  value_type local_2400;
  value_type local_23e0;
  value_type local_23c0;
  long *local_23a0 [2];
  long local_2390 [2];
  value_type local_2380;
  string local_2360;
  long *local_2340 [2];
  long local_2330 [2];
  value_type local_2320;
  long *local_2300 [2];
  long local_22f0 [2];
  value_type local_22e0;
  string local_22c0;
  long *local_22a0 [2];
  long local_2290 [2];
  value_type local_2280;
  string local_2260;
  long *local_2240 [2];
  long local_2230 [2];
  value_type local_2220;
  string local_2200;
  long *local_21e0 [2];
  long local_21d0 [2];
  value_type local_21c0;
  long *local_21a0 [2];
  long local_2190 [2];
  value_type local_2180;
  long *local_2160 [2];
  long local_2150 [2];
  value_type local_2140;
  long *local_2120 [2];
  long local_2110 [2];
  value_type local_2100;
  long *local_20e0 [2];
  long local_20d0 [2];
  value_type local_20c0;
  long *local_20a0 [2];
  long local_2090 [2];
  value_type local_2080;
  long *local_2060 [2];
  long local_2050 [2];
  value_type local_2040;
  long *local_2020 [2];
  long local_2010 [2];
  value_type local_2000;
  value_type local_1fe0;
  long *local_1fc0 [2];
  long local_1fb0 [2];
  value_type local_1fa0;
  value_type local_1f80;
  string local_1f60;
  long *local_1f40 [2];
  long local_1f30 [2];
  value_type local_1f20;
  value_type local_1f00;
  long *local_1ee0 [2];
  long local_1ed0 [2];
  value_type local_1ec0;
  value_type local_1ea0;
  long *local_1e80 [2];
  long local_1e70 [2];
  value_type local_1e60;
  value_type local_1e40;
  string local_1e20;
  long *local_1e00 [2];
  long local_1df0 [2];
  value_type local_1de0;
  value_type local_1dc0;
  long *local_1da0 [2];
  long local_1d90 [2];
  value_type local_1d80;
  long *local_1d60 [2];
  long local_1d50 [2];
  value_type local_1d40;
  long *local_1d20 [2];
  long local_1d10 [2];
  long *local_1d00 [2];
  long local_1cf0 [2];
  string local_1ce0;
  long *local_1cc0 [2];
  long local_1cb0 [2];
  long *local_1ca0 [2];
  long local_1c90 [2];
  value_type local_1c80;
  string local_1c60;
  long *local_1c40 [2];
  long local_1c30 [2];
  value_type local_1c20;
  long *local_1c00 [2];
  long local_1bf0 [2];
  long *local_1be0 [2];
  long local_1bd0 [2];
  long *local_1bc0 [2];
  long local_1bb0 [2];
  value_type local_1ba0;
  long *local_1b80 [2];
  long local_1b70 [2];
  long *local_1b60 [2];
  long local_1b50 [2];
  string local_1b40;
  long *local_1b20 [2];
  long local_1b10 [2];
  value_type local_1b00;
  undefined1 local_1ae0 [32];
  _Alloc_hider local_1ac0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ab0;
  _Alloc_hider local_1aa0;
  size_type local_1a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a80;
  undefined1 local_1a68 [32];
  _Alloc_hider local_1a48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a38;
  _Alloc_hider local_1a28;
  size_type local_1a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a08;
  undefined1 local_19f0 [32];
  _Alloc_hider local_19d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19c0;
  _Alloc_hider local_19b0;
  size_type local_19a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1990;
  undefined1 local_1978 [32];
  _Alloc_hider local_1958;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1948;
  _Alloc_hider local_1938;
  size_type local_1930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1918;
  undefined1 local_1900 [32];
  _Alloc_hider local_18e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18d0;
  _Alloc_hider local_18c0;
  size_type local_18b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18a0;
  undefined1 local_1888 [32];
  _Alloc_hider local_1868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1858;
  _Alloc_hider local_1848;
  size_type local_1840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1838;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1828;
  undefined1 local_1810 [32];
  _Alloc_hider local_17f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17e0;
  _Alloc_hider local_17d0;
  size_type local_17c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17b0;
  undefined1 local_1798 [32];
  _Alloc_hider local_1778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1768;
  _Alloc_hider local_1758;
  size_type local_1750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1738;
  undefined1 local_1720 [32];
  _Alloc_hider local_1700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16f0;
  _Alloc_hider local_16e0;
  size_type local_16d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16c0;
  undefined1 local_16a8 [32];
  _Alloc_hider local_1688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1678;
  _Alloc_hider local_1668;
  size_type local_1660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1648;
  undefined1 local_1630 [64];
  _Alloc_hider local_15f0;
  size_type local_15e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15d0;
  ExeName local_15b8;
  undefined1 local_1590 [64];
  _Alloc_hider local_1550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1540;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1530;
  undefined1 local_1518 [64];
  _Alloc_hider local_14d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b8;
  undefined1 local_14a0 [64];
  _Alloc_hider local_1460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1440;
  undefined1 local_1428 [64];
  _Alloc_hider local_13e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13c8;
  undefined1 local_13b0 [64];
  _Alloc_hider local_1370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1350;
  undefined1 local_1338 [64];
  _Alloc_hider local_12f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d8;
  undefined1 local_12c0 [64];
  _Alloc_hider local_1280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1260;
  undefined1 local_1248 [64];
  _Alloc_hider local_1208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11e8;
  undefined1 local_11d0 [64];
  _Alloc_hider local_1190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1180;
  undefined1 local_1170 [64];
  _Alloc_hider local_1130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1110;
  undefined1 local_10f8 [64];
  _Alloc_hider local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1098;
  undefined1 local_1080 [64];
  _Alloc_hider local_1040;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1030;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1020;
  undefined1 local_1008 [64];
  _Alloc_hider local_fc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fa8;
  undefined1 local_f90 [64];
  _Alloc_hider local_f50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f30;
  undefined1 local_f18 [64];
  _Alloc_hider local_ed8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ec8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_eb8;
  undefined1 local_ea0 [64];
  _Alloc_hider local_e60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e40;
  undefined1 local_e28 [64];
  _Alloc_hider local_de8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc8;
  undefined1 local_db0 [64];
  _Alloc_hider local_d70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d50;
  undefined1 local_d38 [64];
  _Alloc_hider local_cf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cd8;
  undefined1 local_cc0 [64];
  _Alloc_hider local_c80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c60;
  Help local_c48;
  Parser local_bd0;
  Parser local_b70;
  Parser local_b10;
  Parser local_ab0;
  Parser local_a50;
  Parser local_9f0;
  Parser local_990;
  Parser local_930;
  Parser local_8d0;
  Parser local_870;
  Parser local_810;
  Parser local_7b0;
  Parser local_750;
  Parser local_6f0;
  Parser local_690;
  Parser local_630;
  Parser local_5d0;
  Parser local_570;
  Parser local_510;
  Parser local_4b0;
  Parser local_450;
  Parser local_3f0;
  Parser local_390;
  Parser local_330;
  Parser local_2d0;
  Parser local_270;
  Parser local_210;
  Parser local_1b0;
  Parser local_150;
  Parser local_f0;
  Parser local_90;
  
  local_26e8 = __return_storage_ptr__;
  clara::detail::ExeName::ExeName(&local_15b8,&config->processName);
  clara::detail::Help::Help(&local_c48,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_bd0,&local_15b8.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             &local_c48);
  clara::detail::Opt::Opt((Opt *)local_cc0,&config->listTests);
  local_2380._M_dataplus._M_p = (pointer)&local_2380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"-l","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c60,&local_2380);
  local_26e0._M_dataplus._M_p = (pointer)&local_26e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_26e0,"--list-tests","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c60,&local_26e0);
  local_23a0[0] = local_2390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23a0,"list all/matching test cases","");
  std::__cxx11::string::_M_assign((string *)&local_c80);
  clara::detail::Parser::operator|(&local_b70,&local_bd0,(Opt *)local_cc0);
  clara::detail::Opt::Opt((Opt *)local_f90,&config->listTags);
  local_2708._M_dataplus._M_p = (pointer)&local_2708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2708,"-t","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f30,&local_2708);
  local_2728._M_dataplus._M_p = (pointer)&local_2728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2728,"--list-tags","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f30,&local_2728);
  local_1b80[0] = local_1b70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b80,"list all/matching tags","");
  std::__cxx11::string::_M_assign((string *)&local_f50);
  clara::detail::Parser::operator|(&local_b10,&local_b70,(Opt *)local_f90);
  clara::detail::Opt::Opt((Opt *)local_1008,&config->showSuccessfulTests);
  local_23c0._M_dataplus._M_p = (pointer)&local_23c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_23c0,"-s","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fa8,&local_23c0);
  local_1ba0._M_dataplus._M_p = (pointer)&local_1ba0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ba0,"--success","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fa8,&local_1ba0);
  local_1bc0[0] = local_1bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1bc0,"include successful tests in output","");
  std::__cxx11::string::_M_assign((string *)&local_fc8);
  clara::detail::Parser::operator|(&local_ab0,&local_b10,(Opt *)local_1008);
  clara::detail::Opt::Opt((Opt *)local_1080,&config->shouldDebugBreak);
  local_23e0._M_dataplus._M_p = (pointer)&local_23e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_23e0,"-b","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1020,&local_23e0);
  local_2400._M_dataplus._M_p = (pointer)&local_2400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2400,"--break","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1020,&local_2400);
  local_1be0[0] = local_1bd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1be0,"break into debugger on failure","");
  std::__cxx11::string::_M_assign((string *)&local_1040);
  clara::detail::Parser::operator|(&local_a50,&local_ab0,(Opt *)local_1080);
  clara::detail::Opt::Opt((Opt *)local_10f8,&config->noThrow);
  local_2420._M_dataplus._M_p = (pointer)&local_2420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2420,"-e","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1098,&local_2420);
  local_2440._M_dataplus._M_p = (pointer)&local_2440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2440,"--nothrow","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1098,&local_2440);
  local_1c00[0] = local_1bf0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c00,"skip exception tests","");
  std::__cxx11::string::_M_assign((string *)&local_10b8);
  clara::detail::Parser::operator|(&local_9f0,&local_a50,(Opt *)local_10f8);
  clara::detail::Opt::Opt((Opt *)local_1170,&config->showInvisibles);
  local_2460._M_dataplus._M_p = (pointer)&local_2460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2460,"-i","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1110,&local_2460);
  local_1c20._M_dataplus._M_p = (pointer)&local_1c20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c20,"--invisibles","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1110,&local_1c20);
  local_1c40[0] = local_1c30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c40,"show invisibles (tabs, newlines)","");
  std::__cxx11::string::_M_assign((string *)&local_1130);
  clara::detail::Parser::operator|(&local_990,&local_9f0,(Opt *)local_1170);
  local_1c60._M_dataplus._M_p = (pointer)&local_1c60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c60,"filename","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<std::__cxx11::string>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1518,&config->outputFilename,
             &local_1c60);
  local_1518._0_8_ = &PTR__Opt_001a25d0;
  local_14b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c80._M_dataplus._M_p = (pointer)&local_1c80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c80,"-o","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14b8,&local_1c80);
  local_2480._M_dataplus._M_p = (pointer)&local_2480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2480,"--out","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14b8,&local_2480);
  local_1ca0[0] = local_1c90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ca0,"output filename","");
  std::__cxx11::string::_M_assign((string *)&local_14d8);
  clara::detail::Parser::operator|(&local_930,&local_990,(Opt *)local_1518);
  local_24a0 = local_2490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_24a0,"name","");
  local_1ae0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1ae0._8_4_ = Optional;
  local_1ae0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ae0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ae0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ae0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a16d0;
  local_1ae0._16_8_ = local_1ae0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1ae0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1720;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1ae0._24_8_ + 0x10))->_M_use_count =
       config;
  local_1ac0._M_p = (pointer)&local_1ab0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1ac0,local_24a0,local_2498 + (long)local_24a0);
  local_1aa0._M_p = (pointer)&local_1a90;
  local_1a98 = 0;
  local_1a90._M_local_buf[0] = '\0';
  local_1ae0._0_8_ = &PTR__Opt_001a25d0;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_24c0._M_dataplus._M_p = (pointer)&local_24c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_24c0,"-r","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a80,&local_24c0);
  local_24e0._M_dataplus._M_p = (pointer)&local_24e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_24e0,"--reporter","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a80,&local_24e0);
  local_1cc0[0] = local_1cb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1cc0,"reporter to use (defaults to console)","");
  std::__cxx11::string::_M_assign((string *)&local_1aa0);
  clara::detail::Parser::operator|(&local_8d0,&local_930,(Opt *)local_1ae0);
  local_1ce0._M_dataplus._M_p = (pointer)&local_1ce0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ce0,"name","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<std::__cxx11::string>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1590,&config->name,&local_1ce0);
  local_1590._0_8_ = &PTR__Opt_001a25d0;
  local_1530.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1530.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1530.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2500._M_dataplus._M_p = (pointer)&local_2500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2500,"-n","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1530,&local_2500);
  local_2520._M_dataplus._M_p = (pointer)&local_2520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2520,"--name","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1530,&local_2520);
  local_1d00[0] = local_1cf0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d00,"suite name","");
  std::__cxx11::string::_M_assign((string *)&local_1550);
  clara::detail::Parser::operator|(&local_870,&local_8d0,(Opt *)local_1590);
  local_1630._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1770;
  local_1630._16_8_ = local_1630._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1630._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a17c0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1630._24_8_ + 0x10))->_M_use_count =
       config;
  local_1630._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1630._8_4_ = Optional;
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_)->_M_use_count = 2;
  }
  local_1630._32_8_ = local_1630 + 0x30;
  local_1630._40_8_ = 0;
  local_1630[0x30] = '\0';
  local_15f0._M_p = (pointer)&local_15e0;
  local_15e8 = 0;
  local_15e0._M_local_buf[0] = '\0';
  clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_);
  local_1630._0_8_ = &PTR__Opt_001a25d0;
  local_15d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2540._M_dataplus._M_p = (pointer)&local_2540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2540,"-a","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15d0,&local_2540);
  local_2560._M_dataplus._M_p = (pointer)&local_2560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2560,"--abort","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15d0,&local_2560);
  local_1d20[0] = local_1d10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d20,"abort at first failure","");
  std::__cxx11::string::_M_assign((string *)&local_15f0);
  clara::detail::Parser::operator|(&local_810,&local_870,(Opt *)local_1630);
  local_2580 = local_2570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2580,"no. failures","");
  local_16a8._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_16a8._8_4_ = Optional;
  local_16a8._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1810;
  local_16a8._16_8_ = local_16a8._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_16a8._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1860;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_16a8._24_8_ + 0x10))->_M_use_count =
       config;
  local_1688._M_p = (pointer)&local_1678;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1688,local_2580,local_2578 + (long)local_2580);
  local_1668._M_p = (pointer)&local_1658;
  local_1660 = 0;
  local_1658._M_local_buf[0] = '\0';
  local_16a8._0_8_ = &PTR__Opt_001a25d0;
  local_1648.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_25a0._M_dataplus._M_p = (pointer)&local_25a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_25a0,"-x","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1648,&local_25a0);
  local_1d40._M_dataplus._M_p = (pointer)&local_1d40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d40,"--abortx","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1648,&local_1d40);
  local_1d60[0] = local_1d50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d60,"abort after x failures","");
  std::__cxx11::string::_M_assign((string *)&local_1668);
  clara::detail::Parser::operator|(&local_7b0,&local_810,(Opt *)local_16a8);
  local_25c0 = local_25b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_25c0,"warning name","");
  local_1720._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1720._8_4_ = Optional;
  local_1720._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1720._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1720._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1720._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a18b0;
  local_1720._16_8_ = local_1720._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1720._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1900;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1720._24_8_ + 0x10))->_M_use_count =
       config;
  local_1700._M_p = (pointer)&local_16f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1700,local_25c0,local_25b8 + (long)local_25c0);
  local_16e0._M_p = (pointer)&local_16d0;
  local_16d8 = 0;
  local_16d0._M_local_buf[0] = '\0';
  local_1720._0_8_ = &PTR__Opt_001a25d0;
  local_16c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d80._M_dataplus._M_p = (pointer)&local_1d80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d80,"-w","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_16c0,&local_1d80);
  local_25e0._M_dataplus._M_p = (pointer)&local_25e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_25e0,"--warn","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_16c0,&local_25e0);
  local_1da0[0] = local_1d90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1da0,"enable warnings","");
  std::__cxx11::string::_M_assign((string *)&local_16e0);
  clara::detail::Parser::operator|(&local_750,&local_7b0,(Opt *)local_1720);
  local_2600 = local_25f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2600,"yes|no","");
  local_1798._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1798._8_4_ = Optional;
  local_1798._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1798._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1798._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1798._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1950;
  local_1798._16_8_ = local_1798._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1798._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a19a0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1798._24_8_ + 0x10))->_M_use_count =
       config;
  local_1778._M_p = (pointer)&local_1768;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1778,local_2600,local_25f8 + (long)local_2600);
  local_1758._M_p = (pointer)&local_1748;
  local_1750 = 0;
  local_1748._M_local_buf[0] = '\0';
  local_1798._0_8_ = &PTR__Opt_001a25d0;
  local_1738.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1738.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1738.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1dc0._M_dataplus._M_p = (pointer)&local_1dc0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1dc0,"-d","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1738,&local_1dc0);
  local_1de0._M_dataplus._M_p = (pointer)&local_1de0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1de0,"--durations","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1738,&local_1de0);
  local_1e00[0] = local_1df0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e00,"show test durations","");
  std::__cxx11::string::_M_assign((string *)&local_1758);
  clara::detail::Parser::operator|(&local_6f0,&local_750,(Opt *)local_1798);
  local_1e20._M_dataplus._M_p = (pointer)&local_1e20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e20,"seconds","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<double>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_12c0,&config->minDuration,&local_1e20
            );
  local_12c0._0_8_ = &PTR__Opt_001a25d0;
  local_1260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e40._M_dataplus._M_p = (pointer)&local_1e40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e40,"-D","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1260,&local_1e40);
  local_1e60._M_dataplus._M_p = (pointer)&local_1e60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e60,"--min-duration","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1260,&local_1e60);
  local_1e80[0] = local_1e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e80,
             "show test durations for tests taking at least the given number of seconds","");
  std::__cxx11::string::_M_assign((string *)&local_1280);
  clara::detail::Parser::operator|(&local_690,&local_6f0,(Opt *)local_12c0);
  local_2620 = local_2610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2620,"filename","");
  local_1810._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1810._8_4_ = Optional;
  local_1810._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1810._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1810._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1810._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a19f0;
  local_1810._16_8_ = local_1810._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1810._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1a40;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1810._24_8_ + 0x10))->_M_use_count =
       config;
  local_17f0._M_p = (pointer)&local_17e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_17f0,local_2620,local_2618 + (long)local_2620);
  local_17d0._M_p = (pointer)&local_17c0;
  local_17c8 = 0;
  local_17c0._M_local_buf[0] = '\0';
  local_1810._0_8_ = &PTR__Opt_001a25d0;
  local_17b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1ea0._M_dataplus._M_p = (pointer)&local_1ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ea0,"-f","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17b0,&local_1ea0);
  local_1ec0._M_dataplus._M_p = (pointer)&local_1ec0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ec0,"--input-file","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17b0,&local_1ec0);
  local_1ee0[0] = local_1ed0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ee0,"load test names to run from a file","");
  std::__cxx11::string::_M_assign((string *)&local_17d0);
  clara::detail::Parser::operator|(&local_630,&local_690,(Opt *)local_1810);
  clara::detail::Opt::Opt((Opt *)local_d38,&config->filenamesAsTags);
  local_1f00._M_dataplus._M_p = (pointer)&local_1f00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f00,"-#","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cd8,&local_1f00);
  local_1f20._M_dataplus._M_p = (pointer)&local_1f20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f20,"--filenames-as-tags","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cd8,&local_1f20);
  local_1f40[0] = local_1f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f40,"adds a tag for the filename","");
  std::__cxx11::string::_M_assign((string *)&local_cf8);
  clara::detail::Parser::operator|(&local_5d0,&local_630,(Opt *)local_d38);
  local_1f60._M_dataplus._M_p = (pointer)&local_1f60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f60,"section name","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1338,&config->sectionsToRun,
             &local_1f60);
  local_1338._0_8_ = &PTR__Opt_001a25d0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f80._M_dataplus._M_p = (pointer)&local_1f80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f80,"-c","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12d8,&local_1f80);
  local_1fa0._M_dataplus._M_p = (pointer)&local_1fa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fa0,"--section","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12d8,&local_1fa0);
  local_1fc0[0] = local_1fb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fc0,"specify section to run","");
  std::__cxx11::string::_M_assign((string *)&local_12f8);
  clara::detail::Parser::operator|(&local_570,&local_5d0,(Opt *)local_1338);
  local_2640 = local_2630;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2640,"quiet|normal|high","");
  local_1888._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1888._8_4_ = Optional;
  local_1888._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1888._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1888._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1888._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1a90;
  local_1888._16_8_ = local_1888._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1888._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1ae0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1888._24_8_ + 0x10))->_M_use_count =
       config;
  local_1868._M_p = (pointer)&local_1858;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1868,local_2640,local_2638 + (long)local_2640);
  local_1848._M_p = (pointer)&local_1838;
  local_1840 = 0;
  local_1838._M_local_buf[0] = '\0';
  local_1888._0_8_ = &PTR__Opt_001a25d0;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1828.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1fe0._M_dataplus._M_p = (pointer)&local_1fe0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fe0,"-v","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1828,&local_1fe0);
  local_2000._M_dataplus._M_p = (pointer)&local_2000.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2000,"--verbosity","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1828,&local_2000);
  local_2020[0] = local_2010;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2020,"set output verbosity","");
  std::__cxx11::string::_M_assign((string *)&local_1848);
  clara::detail::Parser::operator|(&local_510,&local_570,(Opt *)local_1888);
  clara::detail::Opt::Opt((Opt *)local_db0,&config->listTestNamesOnly);
  local_2040._M_dataplus._M_p = (pointer)&local_2040.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2040,"--list-test-names-only","")
  ;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d50,&local_2040);
  local_2060[0] = local_2050;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2060,"list all/matching test cases names only","");
  std::__cxx11::string::_M_assign((string *)&local_d70);
  clara::detail::Parser::operator|(&local_4b0,&local_510,(Opt *)local_db0);
  clara::detail::Opt::Opt((Opt *)local_e28,&config->listReporters);
  local_2080._M_dataplus._M_p = (pointer)&local_2080.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2080,"--list-reporters","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_dc8,&local_2080);
  local_20a0[0] = local_2090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20a0,"list all reporters","");
  std::__cxx11::string::_M_assign((string *)&local_de8);
  clara::detail::Parser::operator|(&local_450,&local_4b0,(Opt *)local_e28);
  local_2660 = local_2650;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2660,"decl|lex|rand","");
  local_1900._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1900._8_4_ = Optional;
  local_1900._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1900._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1900._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1900._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1b30;
  local_1900._16_8_ = local_1900._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1900._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1b80;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1900._24_8_ + 0x10))->_M_use_count =
       config;
  local_18e0._M_p = (pointer)&local_18d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_18e0,local_2660,local_2658 + (long)local_2660);
  local_18c0._M_p = (pointer)&local_18b0;
  local_18b8 = 0;
  local_18b0._M_local_buf[0] = '\0';
  local_1900._0_8_ = &PTR__Opt_001a25d0;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20c0._M_dataplus._M_p = (pointer)&local_20c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20c0,"--order","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18a0,&local_20c0);
  local_20e0[0] = local_20d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20e0,"test case order (defaults to decl)","");
  std::__cxx11::string::_M_assign((string *)&local_18c0);
  clara::detail::Parser::operator|(&local_3f0,&local_450,(Opt *)local_1900);
  local_2680 = local_2670;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2680,"\'time\'|number","");
  local_1978._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1978._8_4_ = Optional;
  local_1978._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1978._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1978._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1978._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1bd0;
  local_1978._16_8_ = local_1978._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1978._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1c20;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1978._24_8_ + 0x10))->_M_use_count =
       config;
  local_1958._M_p = (pointer)&local_1948;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1958,local_2680,local_2678 + (long)local_2680);
  local_1938._M_p = (pointer)&local_1928;
  local_1930 = 0;
  local_1928._M_local_buf[0] = '\0';
  local_1978._0_8_ = &PTR__Opt_001a25d0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2100._M_dataplus._M_p = (pointer)&local_2100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2100,"--rng-seed","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1918,&local_2100);
  local_2120[0] = local_2110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2120,"set a specific seed for random numbers","");
  std::__cxx11::string::_M_assign((string *)&local_1938);
  clara::detail::Parser::operator|(&local_390,&local_3f0,(Opt *)local_1978);
  local_26a0 = local_2690;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_26a0,"yes|no","");
  local_19f0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_19f0._8_4_ = Optional;
  local_19f0._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19f0._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19f0._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19f0._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1c70;
  local_19f0._16_8_ = local_19f0._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_19f0._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1cc0;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_19f0._24_8_ + 0x10))->_M_use_count =
       config;
  local_19d0._M_p = (pointer)&local_19c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_19d0,local_26a0,local_2698 + (long)local_26a0);
  local_19b0._M_p = (pointer)&local_19a0;
  local_19a8 = 0;
  local_19a0._M_local_buf[0] = '\0';
  local_19f0._0_8_ = &PTR__Opt_001a25d0;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1990.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2140._M_dataplus._M_p = (pointer)&local_2140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2140,"--use-colour","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1990,&local_2140);
  local_2160[0] = local_2150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2160,"should output be colourised","");
  std::__cxx11::string::_M_assign((string *)&local_19b0);
  clara::detail::Parser::operator|(&local_330,&local_390,(Opt *)local_19f0);
  clara::detail::Opt::Opt((Opt *)local_ea0,&config->libIdentify);
  local_2180._M_dataplus._M_p = (pointer)&local_2180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2180,"--libidentify","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e40,&local_2180);
  local_21a0[0] = local_2190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21a0,"report name and version according to libidentify standard","");
  std::__cxx11::string::_M_assign((string *)&local_e60);
  clara::detail::Parser::operator|(&local_2d0,&local_330,(Opt *)local_ea0);
  local_26c0 = local_26b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_26c0,"never|start|exit|both","");
  local_1a68._0_8_ = &PTR__ParserRefImpl_001a26c0;
  local_1a68._8_4_ = Optional;
  local_1a68._24_8_ = operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._24_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._24_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._24_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1d10;
  local_1a68._16_8_ = local_1a68._24_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a68._24_8_ + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001a1d60;
  *(ConfigData **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a68._24_8_ + 0x10))->_M_use_count =
       config;
  local_1a48._M_p = (pointer)&local_1a38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a48,local_26c0,local_26b8 + (long)local_26c0);
  local_1a28._M_p = (pointer)&local_1a18;
  local_1a20 = 0;
  local_1a18._M_local_buf[0] = '\0';
  local_1a68._0_8_ = &PTR__Opt_001a25d0;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_21c0._M_dataplus._M_p = (pointer)&local_21c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_21c0,"--wait-for-keypress","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a08,&local_21c0);
  local_21e0[0] = local_21d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21e0,"waits for a keypress before exiting","");
  std::__cxx11::string::_M_assign((string *)&local_1a28);
  clara::detail::Parser::operator|(&local_270,&local_2d0,(Opt *)local_1a68);
  local_2200._M_dataplus._M_p = (pointer)&local_2200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2200,"samples","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_13b0,&config->benchmarkSamples,
             &local_2200);
  local_13b0._0_8_ = &PTR__Opt_001a25d0;
  local_1350.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1350.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1350.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2220._M_dataplus._M_p = (pointer)&local_2220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2220,"--benchmark-samples","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1350,&local_2220);
  local_2240[0] = local_2230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2240,"number of samples to collect (default: 100)","");
  std::__cxx11::string::_M_assign((string *)&local_1370);
  clara::detail::Parser::operator|(&local_210,&local_270,(Opt *)local_13b0);
  local_2260._M_dataplus._M_p = (pointer)&local_2260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2260,"resamples","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1428,&config->benchmarkResamples,
             &local_2260);
  local_1428._0_8_ = &PTR__Opt_001a25d0;
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2280._M_dataplus._M_p = (pointer)&local_2280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2280,"--benchmark-resamples","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13c8,&local_2280);
  local_22a0[0] = local_2290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_22a0,"number of resamples for the bootstrap (default: 100000)","");
  std::__cxx11::string::_M_assign((string *)&local_13e8);
  clara::detail::Parser::operator|(&local_1b0,&local_210,(Opt *)local_1428);
  local_22c0._M_dataplus._M_p = (pointer)&local_22c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_22c0,"confidence interval","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<double>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_14a0,
             &config->benchmarkConfidenceInterval,&local_22c0);
  local_14a0._0_8_ = &PTR__Opt_001a25d0;
  local_1440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1440.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_22e0._M_dataplus._M_p = (pointer)&local_22e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_22e0,"--benchmark-confidence-interval","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1440,&local_22e0);
  local_2300[0] = local_22f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2300,
             "confidence interval for the bootstrap (between 0 and 1, default: 0.95)","");
  std::__cxx11::string::_M_assign((string *)&local_1460);
  clara::detail::Parser::operator|(&local_150,&local_1b0,(Opt *)local_14a0);
  clara::detail::Opt::Opt((Opt *)local_f18,&config->benchmarkNoAnalysis);
  local_2320._M_dataplus._M_p = (pointer)&local_2320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2320,"--benchmark-no-analysis","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_eb8,&local_2320);
  local_2340[0] = local_2330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2340,"perform only measurements; do not perform any analysis","");
  std::__cxx11::string::_M_assign((string *)&local_ed8);
  clara::detail::Parser::operator|(&local_f0,&local_150,(Opt *)local_f18);
  local_2360._M_dataplus._M_p = (pointer)&local_2360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2360,"benchmarkWarmupTime","");
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl<long>
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1248,&config->benchmarkWarmupTime,
             &local_2360);
  local_1248._0_8_ = &PTR__Opt_001a25d0;
  local_11e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_11e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b00._M_dataplus._M_p = (pointer)&local_1b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b00,"--benchmark-warmup-time","");
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11e8,&local_1b00);
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b20,
             "amount of time in milliseconds spent on warming up each test (default: 100)","");
  std::__cxx11::string::_M_assign((string *)&local_1208);
  clara::detail::Parser::operator|(&local_90,&local_f0,(Opt *)local_1248);
  local_1b40._M_dataplus._M_p = (pointer)&local_1b40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b40,"test name|pattern|tags","")
  ;
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ParserRefImpl<Catch::clara::detail::Arg> *)local_11d0,&config->testsOrTags,&local_1b40
            );
  local_11d0._0_8_ = &PTR__ParserRefImpl_001a2798;
  local_1b60[0] = local_1b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b60,"which test or tests to use","");
  std::__cxx11::string::_M_assign((string *)&local_1190);
  clara::detail::Parser::operator|(local_26e8,&local_90,(Arg *)local_11d0);
  if (local_1b60[0] != local_1b50) {
    operator_delete(local_1b60[0],local_1b50[0] + 1);
  }
  local_11d0._0_8_ = &PTR__ParserRefImpl_001a2818;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1190._M_p != &local_1180) {
    operator_delete(local_1190._M_p,local_1180._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_11d0._32_8_ != local_11d0 + 0x30) {
    operator_delete((void *)local_11d0._32_8_,local_11d0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11d0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11d0._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b40._M_dataplus._M_p != &local_1b40.field_2) {
    operator_delete(local_1b40._M_dataplus._M_p,local_1b40.field_2._M_allocated_capacity + 1);
  }
  local_90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_90.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_90.m_options);
  local_90.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_90.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b20[0] != local_1b10) {
    operator_delete(local_1b20[0],local_1b10[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b00._M_dataplus._M_p != &local_1b00.field_2) {
    operator_delete(local_1b00._M_dataplus._M_p,local_1b00.field_2._M_allocated_capacity + 1);
  }
  local_1248._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_11e8);
  local_1248._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_p != &local_11f8) {
    operator_delete(local_1208._M_p,local_11f8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1248._32_8_ != local_1248 + 0x30) {
    operator_delete((void *)local_1248._32_8_,local_1248._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1248._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1248._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2360._M_dataplus._M_p != &local_2360.field_2) {
    operator_delete(local_2360._M_dataplus._M_p,local_2360.field_2._M_allocated_capacity + 1);
  }
  local_f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_f0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_f0.m_options);
  local_f0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_f0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2340[0] != local_2330) {
    operator_delete(local_2340[0],local_2330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2320._M_dataplus._M_p != &local_2320.field_2) {
    operator_delete(local_2320._M_dataplus._M_p,local_2320.field_2._M_allocated_capacity + 1);
  }
  local_f18._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_eb8);
  local_f18._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_p != &local_ec8) {
    operator_delete(local_ed8._M_p,local_ec8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f18._32_8_ != local_f18 + 0x30) {
    operator_delete((void *)local_f18._32_8_,local_f18._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f18._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f18._24_8_);
  }
  local_150.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_150.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_150.m_options);
  local_150.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_150.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_150.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2300[0] != local_22f0) {
    operator_delete(local_2300[0],local_22f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22e0._M_dataplus._M_p != &local_22e0.field_2) {
    operator_delete(local_22e0._M_dataplus._M_p,local_22e0.field_2._M_allocated_capacity + 1);
  }
  local_14a0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1440);
  local_14a0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1460._M_p != &local_1450) {
    operator_delete(local_1460._M_p,local_1450._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_14a0._32_8_ != local_14a0 + 0x30) {
    operator_delete((void *)local_14a0._32_8_,local_14a0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14a0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14a0._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22c0._M_dataplus._M_p != &local_22c0.field_2) {
    operator_delete(local_22c0._M_dataplus._M_p,local_22c0.field_2._M_allocated_capacity + 1);
  }
  local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_1b0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_1b0.m_options);
  local_1b0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_1b0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_22a0[0] != local_2290) {
    operator_delete(local_22a0[0],local_2290[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2280._M_dataplus._M_p != &local_2280.field_2) {
    operator_delete(local_2280._M_dataplus._M_p,local_2280.field_2._M_allocated_capacity + 1);
  }
  local_1428._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13c8);
  local_1428._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_p != &local_13d8) {
    operator_delete(local_13e8._M_p,local_13d8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1428._32_8_ != local_1428 + 0x30) {
    operator_delete((void *)local_1428._32_8_,local_1428._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1428._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1428._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2260._M_dataplus._M_p != &local_2260.field_2) {
    operator_delete(local_2260._M_dataplus._M_p,local_2260.field_2._M_allocated_capacity + 1);
  }
  local_210.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_210.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_210.m_options);
  local_210.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_210.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2240[0] != local_2230) {
    operator_delete(local_2240[0],local_2230[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2220._M_dataplus._M_p != &local_2220.field_2) {
    operator_delete(local_2220._M_dataplus._M_p,local_2220.field_2._M_allocated_capacity + 1);
  }
  local_13b0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1350);
  local_13b0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1370._M_p != &local_1360) {
    operator_delete(local_1370._M_p,local_1360._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_13b0._32_8_ != local_13b0 + 0x30) {
    operator_delete((void *)local_13b0._32_8_,local_13b0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13b0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13b0._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2200._M_dataplus._M_p != &local_2200.field_2) {
    operator_delete(local_2200._M_dataplus._M_p,local_2200.field_2._M_allocated_capacity + 1);
  }
  local_270.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_270.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_270.m_options);
  local_270.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_270.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_270.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_21e0[0] != local_21d0) {
    operator_delete(local_21e0[0],local_21d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21c0._M_dataplus._M_p != &local_21c0.field_2) {
    operator_delete(local_21c0._M_dataplus._M_p,local_21c0.field_2._M_allocated_capacity + 1);
  }
  local_1a68._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a08);
  local_1a68._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a28._M_p != &local_1a18) {
    operator_delete(local_1a28._M_p,
                    CONCAT71(local_1a18._M_allocated_capacity._1_7_,local_1a18._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a48._M_p != &local_1a38) {
    operator_delete(local_1a48._M_p,local_1a38._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._24_8_);
  }
  if (local_26c0 != local_26b0) {
    operator_delete(local_26c0,local_26b0[0] + 1);
  }
  local_2d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_2d0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_2d0.m_options);
  local_2d0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_2d0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_21a0[0] != local_2190) {
    operator_delete(local_21a0[0],local_2190[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2180._M_dataplus._M_p != &local_2180.field_2) {
    operator_delete(local_2180._M_dataplus._M_p,local_2180.field_2._M_allocated_capacity + 1);
  }
  local_ea0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e40);
  local_ea0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_p != &local_e50) {
    operator_delete(local_e60._M_p,local_e50._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_ea0._32_8_ != local_ea0 + 0x30) {
    operator_delete((void *)local_ea0._32_8_,local_ea0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ea0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ea0._24_8_);
  }
  local_330.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_330.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_330.m_options);
  local_330.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_330.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_330.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2160[0] != local_2150) {
    operator_delete(local_2160[0],local_2150[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2140._M_dataplus._M_p != &local_2140.field_2) {
    operator_delete(local_2140._M_dataplus._M_p,local_2140.field_2._M_allocated_capacity + 1);
  }
  local_19f0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1990);
  local_19f0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19b0._M_p != &local_19a0) {
    operator_delete(local_19b0._M_p,
                    CONCAT71(local_19a0._M_allocated_capacity._1_7_,local_19a0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19d0._M_p != &local_19c0) {
    operator_delete(local_19d0._M_p,local_19c0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19f0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_19f0._24_8_);
  }
  if (local_26a0 != local_2690) {
    operator_delete(local_26a0,local_2690[0] + 1);
  }
  local_390.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_390.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_390.m_options);
  local_390.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_390.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_390.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2120[0] != local_2110) {
    operator_delete(local_2120[0],local_2110[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2100._M_dataplus._M_p != &local_2100.field_2) {
    operator_delete(local_2100._M_dataplus._M_p,local_2100.field_2._M_allocated_capacity + 1);
  }
  local_1978._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1918);
  local_1978._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938._M_p != &local_1928) {
    operator_delete(local_1938._M_p,
                    CONCAT71(local_1928._M_allocated_capacity._1_7_,local_1928._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1958._M_p != &local_1948) {
    operator_delete(local_1958._M_p,local_1948._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1978._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1978._24_8_);
  }
  if (local_2680 != local_2670) {
    operator_delete(local_2680,local_2670[0] + 1);
  }
  local_3f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_3f0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_3f0.m_options);
  local_3f0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_3f0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20e0[0] != local_20d0) {
    operator_delete(local_20e0[0],local_20d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20c0._M_dataplus._M_p != &local_20c0.field_2) {
    operator_delete(local_20c0._M_dataplus._M_p,local_20c0.field_2._M_allocated_capacity + 1);
  }
  local_1900._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_18a0);
  local_1900._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c0._M_p != &local_18b0) {
    operator_delete(local_18c0._M_p,
                    CONCAT71(local_18b0._M_allocated_capacity._1_7_,local_18b0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e0._M_p != &local_18d0) {
    operator_delete(local_18e0._M_p,local_18d0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1900._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1900._24_8_);
  }
  if (local_2660 != local_2650) {
    operator_delete(local_2660,local_2650[0] + 1);
  }
  local_450.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_450.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_450.m_options);
  local_450.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_450.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_450.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_450.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_450.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20a0[0] != local_2090) {
    operator_delete(local_20a0[0],local_2090[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2080._M_dataplus._M_p != &local_2080.field_2) {
    operator_delete(local_2080._M_dataplus._M_p,local_2080.field_2._M_allocated_capacity + 1);
  }
  local_e28._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dc8);
  local_e28._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de8._M_p != &local_dd8) {
    operator_delete(local_de8._M_p,local_dd8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_e28._32_8_ != local_e28 + 0x30) {
    operator_delete((void *)local_e28._32_8_,local_e28._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e28._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e28._24_8_);
  }
  local_4b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_4b0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_4b0.m_options);
  local_4b0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_4b0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_4b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2060[0] != local_2050) {
    operator_delete(local_2060[0],local_2050[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2040._M_dataplus._M_p != &local_2040.field_2) {
    operator_delete(local_2040._M_dataplus._M_p,local_2040.field_2._M_allocated_capacity + 1);
  }
  local_db0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d50);
  local_db0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_p != &local_d60) {
    operator_delete(local_d70._M_p,local_d60._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_db0._32_8_ != local_db0 + 0x30) {
    operator_delete((void *)local_db0._32_8_,local_db0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_db0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_db0._24_8_);
  }
  local_510.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_510.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_510.m_options);
  local_510.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_510.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_510.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_510.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_510.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2020[0] != local_2010) {
    operator_delete(local_2020[0],local_2010[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2000._M_dataplus._M_p != &local_2000.field_2) {
    operator_delete(local_2000._M_dataplus._M_p,local_2000.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fe0._M_dataplus._M_p != &local_1fe0.field_2) {
    operator_delete(local_1fe0._M_dataplus._M_p,local_1fe0.field_2._M_allocated_capacity + 1);
  }
  local_1888._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1828);
  local_1888._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1848._M_p != &local_1838) {
    operator_delete(local_1848._M_p,
                    CONCAT71(local_1838._M_allocated_capacity._1_7_,local_1838._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1868._M_p != &local_1858) {
    operator_delete(local_1868._M_p,local_1858._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1888._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1888._24_8_);
  }
  if (local_2640 != local_2630) {
    operator_delete(local_2640,local_2630[0] + 1);
  }
  local_570.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_570.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_570.m_options);
  local_570.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_570.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_570.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_570.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_570.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1fc0[0] != local_1fb0) {
    operator_delete(local_1fc0[0],local_1fb0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fa0._M_dataplus._M_p != &local_1fa0.field_2) {
    operator_delete(local_1fa0._M_dataplus._M_p,local_1fa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f80._M_dataplus._M_p != &local_1f80.field_2) {
    operator_delete(local_1f80._M_dataplus._M_p,local_1f80.field_2._M_allocated_capacity + 1);
  }
  local_1338._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12d8);
  local_1338._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_p != &local_12e8) {
    operator_delete(local_12f8._M_p,local_12e8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1338._32_8_ != local_1338 + 0x30) {
    operator_delete((void *)local_1338._32_8_,local_1338._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1338._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1338._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f60._M_dataplus._M_p != &local_1f60.field_2) {
    operator_delete(local_1f60._M_dataplus._M_p,local_1f60.field_2._M_allocated_capacity + 1);
  }
  local_5d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_5d0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_5d0.m_options);
  local_5d0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_5d0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1f40[0] != local_1f30) {
    operator_delete(local_1f40[0],local_1f30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f20._M_dataplus._M_p != &local_1f20.field_2) {
    operator_delete(local_1f20._M_dataplus._M_p,local_1f20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f00._M_dataplus._M_p != &local_1f00.field_2) {
    operator_delete(local_1f00._M_dataplus._M_p,local_1f00.field_2._M_allocated_capacity + 1);
  }
  local_d38._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cd8);
  local_d38._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_p != &local_ce8) {
    operator_delete(local_cf8._M_p,local_ce8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d38._32_8_ != local_d38 + 0x30) {
    operator_delete((void *)local_d38._32_8_,local_d38._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d38._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d38._24_8_);
  }
  local_630.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_630.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_630.m_options);
  local_630.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_630.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_630.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_630.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_630.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1ee0[0] != local_1ed0) {
    operator_delete(local_1ee0[0],local_1ed0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ec0._M_dataplus._M_p != &local_1ec0.field_2) {
    operator_delete(local_1ec0._M_dataplus._M_p,local_1ec0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ea0._M_dataplus._M_p != &local_1ea0.field_2) {
    operator_delete(local_1ea0._M_dataplus._M_p,local_1ea0.field_2._M_allocated_capacity + 1);
  }
  local_1810._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17b0);
  local_1810._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d0._M_p != &local_17c0) {
    operator_delete(local_17d0._M_p,
                    CONCAT71(local_17c0._M_allocated_capacity._1_7_,local_17c0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0._M_p != &local_17e0) {
    operator_delete(local_17f0._M_p,local_17e0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1810._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1810._24_8_);
  }
  if (local_2620 != local_2610) {
    operator_delete(local_2620,local_2610[0] + 1);
  }
  local_690.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_690.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_690.m_options);
  local_690.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_690.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_690.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_690.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_690.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1e80[0] != local_1e70) {
    operator_delete(local_1e80[0],local_1e70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e60._M_dataplus._M_p != &local_1e60.field_2) {
    operator_delete(local_1e60._M_dataplus._M_p,local_1e60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e40._M_dataplus._M_p != &local_1e40.field_2) {
    operator_delete(local_1e40._M_dataplus._M_p,local_1e40.field_2._M_allocated_capacity + 1);
  }
  local_12c0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1260);
  local_12c0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1280._M_p != &local_1270) {
    operator_delete(local_1280._M_p,local_1270._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_12c0._32_8_ != local_12c0 + 0x30) {
    operator_delete((void *)local_12c0._32_8_,local_12c0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12c0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_12c0._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e20._M_dataplus._M_p != &local_1e20.field_2) {
    operator_delete(local_1e20._M_dataplus._M_p,local_1e20.field_2._M_allocated_capacity + 1);
  }
  local_6f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_6f0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_6f0.m_options);
  local_6f0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_6f0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6f0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_6f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1e00[0] != local_1df0) {
    operator_delete(local_1e00[0],local_1df0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1de0._M_dataplus._M_p != &local_1de0.field_2) {
    operator_delete(local_1de0._M_dataplus._M_p,local_1de0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1dc0._M_dataplus._M_p != &local_1dc0.field_2) {
    operator_delete(local_1dc0._M_dataplus._M_p,local_1dc0.field_2._M_allocated_capacity + 1);
  }
  local_1798._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1738);
  local_1798._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._M_p != &local_1748) {
    operator_delete(local_1758._M_p,
                    CONCAT71(local_1748._M_allocated_capacity._1_7_,local_1748._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1778._M_p != &local_1768) {
    operator_delete(local_1778._M_p,local_1768._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1798._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1798._24_8_);
  }
  if (local_2600 != local_25f0) {
    operator_delete(local_2600,local_25f0[0] + 1);
  }
  local_750.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_750.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_750.m_options);
  local_750.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_750.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_750.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_750.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_750.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1da0[0] != local_1d90) {
    operator_delete(local_1da0[0],local_1d90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e0._M_dataplus._M_p != &local_25e0.field_2) {
    operator_delete(local_25e0._M_dataplus._M_p,local_25e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d80._M_dataplus._M_p != &local_1d80.field_2) {
    operator_delete(local_1d80._M_dataplus._M_p,local_1d80.field_2._M_allocated_capacity + 1);
  }
  local_1720._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16c0);
  local_1720._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16e0._M_p != &local_16d0) {
    operator_delete(local_16e0._M_p,
                    CONCAT71(local_16d0._M_allocated_capacity._1_7_,local_16d0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1700._M_p != &local_16f0) {
    operator_delete(local_1700._M_p,local_16f0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1720._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1720._24_8_);
  }
  if (local_25c0 != local_25b0) {
    operator_delete(local_25c0,local_25b0[0] + 1);
  }
  local_7b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_7b0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_7b0.m_options);
  local_7b0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_7b0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1d60[0] != local_1d50) {
    operator_delete(local_1d60[0],local_1d50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d40._M_dataplus._M_p != &local_1d40.field_2) {
    operator_delete(local_1d40._M_dataplus._M_p,local_1d40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25a0._M_dataplus._M_p != &local_25a0.field_2) {
    operator_delete(local_25a0._M_dataplus._M_p,local_25a0.field_2._M_allocated_capacity + 1);
  }
  local_16a8._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1648);
  local_16a8._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1668._M_p != &local_1658) {
    operator_delete(local_1668._M_p,
                    CONCAT71(local_1658._M_allocated_capacity._1_7_,local_1658._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1688._M_p != &local_1678) {
    operator_delete(local_1688._M_p,local_1678._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._24_8_);
  }
  if (local_2580 != local_2570) {
    operator_delete(local_2580,local_2570[0] + 1);
  }
  local_810.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_810.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_810.m_options);
  local_810.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_810.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_810.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_810.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_810.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1d20[0] != local_1d10) {
    operator_delete(local_1d20[0],local_1d10[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2560._M_dataplus._M_p != &local_2560.field_2) {
    operator_delete(local_2560._M_dataplus._M_p,local_2560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2540._M_dataplus._M_p != &local_2540.field_2) {
    operator_delete(local_2540._M_dataplus._M_p,local_2540.field_2._M_allocated_capacity + 1);
  }
  local_1630._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_15d0);
  local_1630._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f0._M_p != &local_15e0) {
    operator_delete(local_15f0._M_p,
                    CONCAT71(local_15e0._M_allocated_capacity._1_7_,local_15e0._M_local_buf[0]) + 1)
    ;
  }
  if ((undefined1 *)local_1630._32_8_ != local_1630 + 0x30) {
    operator_delete((void *)local_1630._32_8_,CONCAT71(local_1630._49_7_,local_1630[0x30]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1630._24_8_);
  }
  local_870.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_870.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_870.m_options);
  local_870.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_870.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_870.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_870.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_870.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1d00[0] != local_1cf0) {
    operator_delete(local_1d00[0],local_1cf0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2520._M_dataplus._M_p != &local_2520.field_2) {
    operator_delete(local_2520._M_dataplus._M_p,local_2520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2500._M_dataplus._M_p != &local_2500.field_2) {
    operator_delete(local_2500._M_dataplus._M_p,local_2500.field_2._M_allocated_capacity + 1);
  }
  local_1590._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1530);
  local_1590._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_p != &local_1540) {
    operator_delete(local_1550._M_p,local_1540._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1590._32_8_ != local_1590 + 0x30) {
    operator_delete((void *)local_1590._32_8_,local_1590._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1590._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1590._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ce0._M_dataplus._M_p != &local_1ce0.field_2) {
    operator_delete(local_1ce0._M_dataplus._M_p,local_1ce0.field_2._M_allocated_capacity + 1);
  }
  local_8d0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_8d0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_8d0.m_options);
  local_8d0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_8d0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8d0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8d0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8d0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1cc0[0] != local_1cb0) {
    operator_delete(local_1cc0[0],local_1cb0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24e0._M_dataplus._M_p != &local_24e0.field_2) {
    operator_delete(local_24e0._M_dataplus._M_p,local_24e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24c0._M_dataplus._M_p != &local_24c0.field_2) {
    operator_delete(local_24c0._M_dataplus._M_p,local_24c0.field_2._M_allocated_capacity + 1);
  }
  local_1ae0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a80);
  local_1ae0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1aa0._M_p != &local_1a90) {
    operator_delete(local_1aa0._M_p,
                    CONCAT71(local_1a90._M_allocated_capacity._1_7_,local_1a90._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ac0._M_p != &local_1ab0) {
    operator_delete(local_1ac0._M_p,local_1ab0._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ae0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ae0._24_8_);
  }
  if (local_24a0 != local_2490) {
    operator_delete(local_24a0,local_2490[0] + 1);
  }
  local_930.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_930.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_930.m_options);
  local_930.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_930.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_930.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_930.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_930.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1ca0[0] != local_1c90) {
    operator_delete(local_1ca0[0],local_1c90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2480._M_dataplus._M_p != &local_2480.field_2) {
    operator_delete(local_2480._M_dataplus._M_p,local_2480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c80._M_dataplus._M_p != &local_1c80.field_2) {
    operator_delete(local_1c80._M_dataplus._M_p,local_1c80.field_2._M_allocated_capacity + 1);
  }
  local_1518._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14b8);
  local_1518._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d8._M_p != &local_14c8) {
    operator_delete(local_14d8._M_p,local_14c8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1518._32_8_ != local_1518 + 0x30) {
    operator_delete((void *)local_1518._32_8_,local_1518._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1518._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1518._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
    operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
  }
  local_990.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_990.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_990.m_options);
  local_990.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_990.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_990.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1c40[0] != local_1c30) {
    operator_delete(local_1c40[0],local_1c30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c20._M_dataplus._M_p != &local_1c20.field_2) {
    operator_delete(local_1c20._M_dataplus._M_p,local_1c20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2460._M_dataplus._M_p != &local_2460.field_2) {
    operator_delete(local_2460._M_dataplus._M_p,local_2460.field_2._M_allocated_capacity + 1);
  }
  local_1170._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1110);
  local_1170._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_p != &local_1120) {
    operator_delete(local_1130._M_p,local_1120._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1170._32_8_ != local_1170 + 0x30) {
    operator_delete((void *)local_1170._32_8_,local_1170._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1170._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1170._24_8_);
  }
  local_9f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_9f0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_9f0.m_options);
  local_9f0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_9f0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9f0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_9f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1c00[0] != local_1bf0) {
    operator_delete(local_1c00[0],local_1bf0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2440._M_dataplus._M_p != &local_2440.field_2) {
    operator_delete(local_2440._M_dataplus._M_p,local_2440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2420._M_dataplus._M_p != &local_2420.field_2) {
    operator_delete(local_2420._M_dataplus._M_p,local_2420.field_2._M_allocated_capacity + 1);
  }
  local_10f8._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1098);
  local_10f8._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b8._M_p != &local_10a8) {
    operator_delete(local_10b8._M_p,local_10a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_10f8._32_8_ != local_10f8 + 0x30) {
    operator_delete((void *)local_10f8._32_8_,local_10f8._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10f8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10f8._24_8_);
  }
  local_a50.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_a50.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_a50.m_options);
  local_a50.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_a50.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a50.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a50.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a50.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1be0[0] != local_1bd0) {
    operator_delete(local_1be0[0],local_1bd0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2400._M_dataplus._M_p != &local_2400.field_2) {
    operator_delete(local_2400._M_dataplus._M_p,local_2400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23e0._M_dataplus._M_p != &local_23e0.field_2) {
    operator_delete(local_23e0._M_dataplus._M_p,local_23e0.field_2._M_allocated_capacity + 1);
  }
  local_1080._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1020);
  local_1080._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._M_p != &local_1030) {
    operator_delete(local_1040._M_p,local_1030._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1080._32_8_ != local_1080 + 0x30) {
    operator_delete((void *)local_1080._32_8_,local_1080._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1080._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1080._24_8_);
  }
  local_ab0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_ab0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_ab0.m_options);
  local_ab0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_ab0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ab0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ab0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ab0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1bc0[0] != local_1bb0) {
    operator_delete(local_1bc0[0],local_1bb0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ba0._M_dataplus._M_p != &local_1ba0.field_2) {
    operator_delete(local_1ba0._M_dataplus._M_p,local_1ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23c0._M_dataplus._M_p != &local_23c0.field_2) {
    operator_delete(local_23c0._M_dataplus._M_p,local_23c0.field_2._M_allocated_capacity + 1);
  }
  local_1008._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_fa8);
  local_1008._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc8._M_p != &local_fb8) {
    operator_delete(local_fc8._M_p,local_fb8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1008._32_8_ != local_1008 + 0x30) {
    operator_delete((void *)local_1008._32_8_,local_1008._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1008._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1008._24_8_);
  }
  local_b10.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_b10.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_b10.m_options);
  local_b10.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_b10.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b10.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b10.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b10.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1b80[0] != local_1b70) {
    operator_delete(local_1b80[0],local_1b70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2728._M_dataplus._M_p != &local_2728.field_2) {
    operator_delete(local_2728._M_dataplus._M_p,local_2728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2708._M_dataplus._M_p != &local_2708.field_2) {
    operator_delete(local_2708._M_dataplus._M_p,local_2708.field_2._M_allocated_capacity + 1);
  }
  local_f90._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f30);
  local_f90._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_p != &local_f40) {
    operator_delete(local_f50._M_p,local_f40._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f90._32_8_ != local_f90 + 0x30) {
    operator_delete((void *)local_f90._32_8_,local_f90._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f90._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f90._24_8_);
  }
  local_b70.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_b70.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_b70.m_options);
  local_b70.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_b70.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b70.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_23a0[0] != local_2390) {
    operator_delete(local_23a0[0],local_2390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26e0._M_dataplus._M_p != &local_26e0.field_2) {
    operator_delete(local_26e0._M_dataplus._M_p,local_26e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2380._M_dataplus._M_p != &local_2380.field_2) {
    operator_delete(local_2380._M_dataplus._M_p,local_2380.field_2._M_allocated_capacity + 1);
  }
  local_cc0._0_8_ = &PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c60);
  local_cc0._0_8_ = &PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c80._M_p != &local_c70) {
    operator_delete(local_c80._M_p,local_c70._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_cc0._32_8_ != local_cc0 + 0x30) {
    operator_delete((void *)local_cc0._32_8_,local_cc0._48_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cc0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_cc0._24_8_);
  }
  local_bd0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001a28f0;
  clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_bd0.m_args);
  clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_bd0.m_options);
  local_bd0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_bd0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_bd0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__Opt_001a25d0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c48.super_Opt.m_optNames);
  local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (ParserBase)&PTR__ParserRefImpl_001a26c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.
         _M_dataplus._M_p !=
      &local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.field_2) {
    operator_delete(local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description
                    ._M_dataplus._M_p,
                    local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_description
                    .field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint._M_dataplus._M_p
      != &local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.field_2) {
    operator_delete(local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.
                    _M_dataplus._M_p,
                    local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.
                    field_2._M_allocated_capacity + 1);
  }
  if (local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c48.super_Opt.super_ParserRefImpl<Catch::clara::detail::Opt>.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_15b8.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001a21a0;
  if (local_15b8.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15b8.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_15b8.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_15b8.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return local_26e8;
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }